

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O2

void Cffgknl(fitsfile *fptr,char *keyroot,int nstart,int nkeys,int *numval,int *nfound,int *status)

{
  ulong uVar1;
  ulong uVar2;
  
  ffgknl(fptr,keyroot,nstart,nkeys,numval,nfound,status);
  uVar1 = 0;
  uVar2 = (ulong)(uint)nkeys;
  if (nkeys < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    numval[uVar1] = (uint)(numval[uVar1] != 0);
  }
  return;
}

Assistant:

void Cffgknl( fitsfile *fptr, char *keyroot, int nstart, int nkeys,
              int *numval, int *nfound, int *status )
{
   int i;
 
   for( i=0; i<nkeys; i++ )  /*  This preserves array elements across call  */
      numval[i] = F2CLOGICAL(numval[i]);
   ffgknl( fptr, keyroot, nstart, nkeys, numval, nfound, status );
   for( i=0; i<nkeys; i++ )
      numval[i] = C2FLOGICAL(numval[i]);
}